

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

ssize_t __thiscall
kj::anon_unknown_31::PromiseIoStream::write(PromiseIoStream *this,int __fd,void *__buf,size_t __n)

{
  AsyncIoStream *pAVar1;
  undefined4 in_register_00000034;
  Own<kj::AsyncIoStream> *pOVar2;
  Own<kj::AsyncIoStream> *local_68;
  PromiseIoStream *local_60;
  ArrayPtr<const_unsigned_char> *pAStack_58;
  Type local_50;
  ArrayPtr<const_unsigned_char> *local_38;
  Own<kj::AsyncIoStream> *local_30;
  Own<kj::AsyncIoStream> *s;
  PromiseIoStream *this_local;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> pieces_local;
  
  pOVar2 = (Own<kj::AsyncIoStream> *)CONCAT44(in_register_00000034,__fd);
  s = pOVar2;
  this_local = (PromiseIoStream *)__buf;
  pieces_local.ptr = (ArrayPtr<const_unsigned_char> *)__n;
  pieces_local.size_ = (size_t)this;
  local_30 = _::readMaybe<kj::AsyncIoStream>((Maybe<kj::Own<kj::AsyncIoStream>_> *)&pOVar2[2].ptr);
  if (local_30 == (Own<kj::AsyncIoStream> *)0x0) {
    ForkedPromise<void>::addBranch((ForkedPromise<void> *)&local_50);
    local_60 = this_local;
    pAStack_58 = pieces_local.ptr;
    local_68 = pOVar2;
    Promise<void>::
    then<kj::(anonymous_namespace)::PromiseIoStream::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_1_,kj::_::PropagateException>
              ((Promise<void> *)this,&local_50,(PropagateException *)&local_68);
    Promise<void>::~Promise((Promise<void> *)&local_50);
  }
  else {
    pAVar1 = Own<kj::AsyncIoStream>::get(local_30);
    local_50.pieces.size_ = (size_t)this_local;
    local_38 = pieces_local.ptr;
    (*(pAVar1->super_AsyncOutputStream)._vptr_AsyncOutputStream[1])
              (this,&pAVar1->super_AsyncOutputStream,this_local,pieces_local.ptr);
  }
  return (ssize_t)this;
}

Assistant:

kj::Promise<void> write(kj::ArrayPtr<const kj::ArrayPtr<const byte>> pieces) override {
    KJ_IF_MAYBE(s, stream) {
      return s->get()->write(pieces);
    } else {
      return promise.addBranch().then([this,pieces]() {
        return KJ_ASSERT_NONNULL(stream)->write(pieces);
      });
    }
  }